

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

void gnuplotio::
     deref_and_print<gnuplotio::PairOfRange<gnuplotio::IteratorRange<double_const*,double>,gnuplotio::IteratorRange<double_const*,double>>,gnuplotio::IteratorRange<double_const*,double>,gnuplotio::ModeText>
               (ostream *stream,long arg)

{
  PairOfRange<gnuplotio::PairOfRange<gnuplotio::IteratorRange<const_double_*,_double>,_gnuplotio::IteratorRange<const_double_*,_double>_>,_gnuplotio::IteratorRange<const_double_*,_double>_>
  *arg_local;
  ostream *stream_local;
  
  deref_and_print<gnuplotio::IteratorRange<double_const*,double>,gnuplotio::IteratorRange<double_const*,double>,gnuplotio::ModeText>
            (stream,arg);
  std::operator<<(stream," ");
  deref_and_print<gnuplotio::IteratorRange<double_const*,double>,gnuplotio::ModeText>
            (stream,arg + 0x20);
  return;
}

Assistant:

void deref_and_print(std::ostream &stream, const PairOfRange<T, U> &arg, PrintMode) {
    deref_and_print(stream, arg.l, PrintMode());
    if(PrintMode::is_text) stream << " ";
    deref_and_print(stream, arg.r, PrintMode());
}